

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O3

void __thiscall
OnDiskDataset::execute(OnDiskDataset *this,Query *query,ResultWriter *out,QueryCounters *counters)

{
  pointer pOVar1;
  FileId *pFVar2;
  source_loc loc;
  logger *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  ResultWriter *pRVar4;
  FileId *pFVar5;
  OnDiskIndex *ndx;
  pointer pOVar6;
  string_view_t fmt;
  pair<std::__detail::_Node_iterator<IndexType,_true,_false>,_bool> pVar7;
  QueryResult result;
  Query plan;
  unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
  types_to_query;
  _Any_data local_130;
  ResultWriter *local_120;
  code *local_118;
  QueryCounters *local_110;
  Query *local_108;
  ResultWriter *local_100;
  undefined1 local_f8 [48];
  bool local_c8 [24];
  Query local_b0;
  _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pOVar6 = (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar1 = (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_110 = counters;
  local_108 = query;
  local_100 = out;
  if (pOVar6 != pOVar1) {
    pRVar4 = out;
    do {
      local_b0.type = pOVar6->ntype;
      pVar7 = std::
              _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_emplace<IndexType>(&local_68,&local_b0,pRVar4);
      pRVar4 = pVar7._8_8_;
      pOVar6 = pOVar6 + 1;
    } while (pOVar6 != pOVar1);
  }
  Query::plan(&local_b0,local_108,
              (unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
               *)&local_68);
  q_optimize((Query *)local_f8,&local_b0);
  Query::operator=(&local_b0,(Query *)local_f8);
  std::vector<Query,_std::allocator<Query>_>::~vector
            ((vector<Query,_std::allocator<Query>_> *)local_c8);
  std::vector<QToken,_std::allocator<QToken>_>::~vector
            ((vector<QToken,_std::allocator<QToken>_> *)(local_f8 + 8));
  this_00 = spdlog::default_logger_raw();
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (pointer)0x0;
  local_f8._16_8_ = (pointer)0x0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt.size_ = 8;
  fmt.data_ = "PLAN: {}";
  spdlog::logger::log<Query>(this_00,loc,debug,fmt,&local_b0);
  OnDiskDataset::query((QueryResult *)local_f8,this,&local_b0,local_110);
  if (local_c8[0] == true) {
    local_130._8_8_ = 0;
    local_130._M_unused._M_object = &local_100;
    local_118 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskDataset.cpp:109:13)>
                ::_M_invoke;
    local_120 = (ResultWriter *)
                std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskDataset.cpp:109:13)>
                ::_M_manager;
    OnDiskFileIndex::for_each_filename
              ((OnDiskFileIndex *)&this->files_index,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_130);
    if (local_120 != (ResultWriter *)0x0) {
      (*(code *)local_120)(&local_130,&local_130,3);
    }
  }
  else {
    pvVar3 = SortedRun::decompressed((SortedRun *)local_f8);
    pFVar5 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pFVar2 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pFVar5 != pFVar2) {
      do {
        OnDiskFileIndex::get_file_name_abi_cxx11_
                  ((string *)&local_130,(OnDiskFileIndex *)&this->files_index,*pFVar5);
        (*out->_vptr_ResultWriter[2])(out,&local_130);
        if ((ResultWriter **)local_130._M_unused._0_8_ != &local_120) {
          operator_delete(local_130._M_unused._M_object,
                          (ulong)((long)&local_120->_vptr_ResultWriter + 1));
        }
        pFVar5 = pFVar5 + 1;
      } while (pFVar5 != pFVar2);
    }
  }
  if ((pointer)local_f8._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_f8._24_8_,local_f8._40_8_ - local_f8._24_8_);
  }
  if ((pointer)local_f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  std::vector<Query,_std::allocator<Query>_>::~vector(&local_b0.queries);
  std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_b0.value);
  std::
  _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void OnDiskDataset::execute(const Query &query, ResultWriter *out,
                            QueryCounters *counters) const {
    std::unordered_set<IndexType> types_to_query;
    for (const auto &ndx : get_indexes()) {
        types_to_query.emplace(ndx.index_type());
    }
    Query plan = query.plan(types_to_query);
    plan = q_optimize(std::move(plan));
    spdlog::debug("PLAN: {}", plan);

    QueryResult result = this->query(plan, counters);
    if (result.is_everything()) {
        files_index->for_each_filename(
            [&out](const std::string &fname) { out->push_back(fname); });
    } else {
        for (const auto &fid : result.vector().decompressed()) {
            out->push_back(get_file_name(fid));
        }
    }
}